

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O3

void __thiscall efsw::FileWatcherInotify::run(FileWatcherInotify *this)

{
  size_type *psVar1;
  uint uVar2;
  _Base_ptr p_Var3;
  pointer ppVar4;
  Watcher *pWVar5;
  pointer pcVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  _Rb_tree_node_base *p_Var10;
  size_t sVar11;
  long *plVar12;
  _Rb_tree_node_base *p_Var13;
  Watcher *pWVar14;
  pointer ppVar15;
  long lVar16;
  WatcherInotify *pWVar17;
  pointer ppVar18;
  _Rb_tree_node_base *p_Var19;
  _Rb_tree_node_base *p_Var20;
  undefined8 uVar21;
  pointer ppVar22;
  WatcherInotify *pWVar23;
  pair<efsw::Watcher_**,_long> pVar24;
  Lock lock;
  vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> eraseWatches;
  Watcher *oldWatch;
  string prevOldFileName;
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  movedOutsideWatches;
  timeval timeout;
  fd_set rfds;
  int local_24c;
  undefined1 local_248 [8];
  _Alloc_hider local_240;
  undefined1 local_238 [28];
  uint local_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  pointer local_208;
  vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
  *local_200;
  _Alloc_hider local_1f8;
  _Rb_tree_node_base *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  WatcherInotify *local_1d8;
  void *local_1d0;
  _Alloc_hider local_1c8;
  char *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  timeval local_e8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  fd_set local_b8;
  
  local_1d0 = operator_new__(0x404000);
  uVar21 = (WatcherInotify *)0x0;
  memset(local_1d0,0,0x404000);
  local_1c0 = local_1b8._M_local_buf + 8;
  local_1b8._M_allocated_capacity = 0;
  local_1b8._M_local_buf[8] = '\0';
  local_200 = (vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
               *)&this->mMovedOutsideWatches;
  local_1f8._M_p = (pointer)&this->mWatchesLock;
  p_Var20 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_24c = -1;
  p_Var13 = (_Rb_tree_node_base *)0x0;
  local_21c = 0;
  local_1f0 = p_Var20;
  do {
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    iVar8 = this->mFD;
    iVar7 = iVar8 + 0x3f;
    if (-1 < iVar8) {
      iVar7 = iVar8;
    }
    local_b8.fds_bits[iVar7 >> 6] =
         local_b8.fds_bits[iVar7 >> 6] | 1L << ((byte)(iVar8 % 0x40) & 0x3f);
    local_e8.tv_sec = 0;
    local_e8.tv_usec = 100000;
    iVar8 = select(0x400,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_e8);
    if (iVar8 < 1) {
      local_24c = -1;
      if ((WatcherInotify *)uVar21 != (WatcherInotify *)0x0) {
        local_240._M_p = local_238 + 8;
        pcVar6 = (((WatcherInotify *)uVar21)->super_Watcher).OldFileName._M_dataplus._M_p;
        local_248 = (undefined1  [8])uVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar6,
                   pcVar6 + (((WatcherInotify *)uVar21)->super_Watcher).OldFileName._M_string_length
                  );
        std::
        vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
        ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                  (local_200,
                   (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_248);
        if (local_240._M_p != local_238 + 8) {
          operator_delete(local_240._M_p);
        }
      }
      uVar21 = (WatcherInotify *)0x0;
    }
    else {
      uVar9 = read(this->mFD,local_1d0,0x404000);
      if (0 < (long)uVar9) {
        local_218._8_8_ = (Watcher **)0x0;
        local_218._M_allocated_capacity = uVar9;
        do {
          Mutex::lock((Mutex *)local_1f8._M_p);
          local_208 = (pointer)((long)local_1d0 + local_218._8_8_);
          p_Var19 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = p_Var20;
          if (p_Var19 != (_Rb_tree_node_base *)0x0) {
            lVar16 = (long)*(int *)&local_208->first;
            p_Var10 = p_Var20;
            do {
              if (lVar16 <= *(long *)(p_Var19 + 1)) {
                p_Var10 = p_Var19;
              }
              p_Var19 = (&p_Var19->_M_left)[*(long *)(p_Var19 + 1) < lVar16];
            } while (p_Var19 != (_Base_ptr)0x0);
            if ((p_Var10 != p_Var20) && (p_Var13 = p_Var10, lVar16 < *(long *)(p_Var10 + 1))) {
              p_Var13 = p_Var20;
            }
          }
          Mutex::unlock((Mutex *)local_1f8._M_p);
          ppVar15 = local_208;
          if (p_Var13 != p_Var20) {
            p_Var3 = p_Var13[1]._M_parent;
            psVar1 = &(local_208->second)._M_string_length;
            local_248 = (undefined1  [8])local_238;
            sVar11 = strlen((char *)psVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,psVar1,(long)&(ppVar15->second)._M_string_length + sVar11
                      );
            uVar2 = *(uint *)((long)&ppVar15->first + 4);
            local_108[0] = local_f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
            (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                      (this,p_Var3,local_248,(ulong)uVar2,(string *)local_108);
            if (local_108[0] != local_f8) {
              operator_delete(local_108[0]);
            }
            p_Var20 = local_1f0;
            ppVar15 = local_208;
            if (local_248 != (undefined1  [8])local_238) {
              operator_delete((void *)local_248);
            }
            uVar2 = *(uint *)((long)&ppVar15->first + 4);
            if ((((char)uVar2 < '\0') &&
                ((WatcherInotify *)p_Var13[1]._M_parent == (WatcherInotify *)uVar21)) &&
               (*(int *)&(ppVar15->second)._M_dataplus._M_p == local_24c)) {
LAB_0010b8dc:
              local_24c = -1;
              uVar21 = (WatcherInotify *)0x0;
              uVar9 = local_218._M_allocated_capacity;
            }
            else if ((uVar2 & 0x40) == 0) {
              local_24c = -1;
              if ((WatcherInotify *)uVar21 == (WatcherInotify *)0x0) goto LAB_0010b8dc;
              local_240._M_p = local_238 + 8;
              local_248 = (undefined1  [8])uVar21;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_240,local_1c0,local_1c0 + local_1b8._M_allocated_capacity)
              ;
              std::
              vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
              ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                        (local_200,
                         (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_248);
              uVar9 = local_218._M_allocated_capacity;
              if (local_240._M_p != local_238 + 8) {
                operator_delete(local_240._M_p);
              }
              uVar21 = (WatcherInotify *)0x0;
            }
            else {
              if (((byte)local_21c & (WatcherInotify *)uVar21 != (WatcherInotify *)0x0) == 1) {
                local_240._M_p = local_238 + 8;
                local_248 = (undefined1  [8])uVar21;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_240,local_1c0,
                           local_1c0 + local_1b8._M_allocated_capacity);
                std::
                vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                          (local_200,
                           (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_248);
                if (local_240._M_p != local_238 + 8) {
                  operator_delete(local_240._M_p);
                }
              }
              uVar21 = p_Var13[1]._M_parent;
              local_24c = *(int *)&(ppVar15->second)._M_dataplus._M_p;
              uVar9 = local_218._M_allocated_capacity;
            }
          }
          local_21c = *(uint *)((long)&ppVar15->first + 4) & 0x40;
          if (local_21c != 0) {
            psVar1 = &(ppVar15->second)._M_string_length;
            local_248 = (undefined1  [8])local_238;
            sVar11 = strlen((char *)psVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,psVar1,(long)&(ppVar15->second)._M_string_length + sVar11
                      );
            std::__cxx11::string::operator=((string *)&local_1c0,(string *)local_248);
            ppVar15 = local_208;
            p_Var20 = local_1f0;
            uVar9 = local_218._M_allocated_capacity;
            if (local_248 != (undefined1  [8])local_238) {
              operator_delete((void *)local_248);
              ppVar15 = local_208;
              p_Var20 = local_1f0;
              uVar9 = local_218._M_allocated_capacity;
            }
          }
          local_21c = local_21c >> 6;
          local_218._8_8_ =
               local_218._8_8_ + (ulong)*(uint *)((long)&(ppVar15->second)._M_dataplus._M_p + 4) +
               0x10;
        } while ((long)local_218._8_8_ < (long)uVar9);
      }
    }
    if ((this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_1a0,
               (vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_200);
      ppVar15 = local_1a0.
                super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar22 = local_1a0.
                super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_218._M_allocated_capacity = uVar21;
      if (local_1a0.
          super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1a0.
          super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          ppVar18 = (this->mMovedOutsideWatches).
                    super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar4 = (this->mMovedOutsideWatches).
                   super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((long)ppVar4 - (long)ppVar18 ==
              (long)ppVar15 -
              (long)local_1a0.
                    super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
            pWVar23 = ppVar22->first;
LAB_0010ba4e:
            local_1e8._M_allocated_capacity = 0;
            local_1e8._8_8_ = (Watcher **)0x0;
            local_1d8 = (WatcherInotify *)0x0;
            Mutex::lock((Mutex *)local_1f8._M_p);
            local_208 = ppVar22;
            if (p_Var13 != p_Var20) {
              do {
                local_1c8._M_p = (pointer)p_Var13[1]._M_parent;
                if ((WatcherInotify *)local_1c8._M_p != pWVar23) {
                  std::operator+(&local_188,&(pWVar23->super_Watcher).Directory,&ppVar22->second);
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_188);
                  local_248 = (undefined1  [8])local_238;
                  pWVar17 = (WatcherInotify *)(plVar12 + 2);
                  if ((WatcherInotify *)*plVar12 == pWVar17) {
                    local_238._0_8_ = (pWVar17->super_Watcher)._vptr_Watcher;
                    local_238._8_8_ = plVar12[3];
                  }
                  else {
                    local_238._0_8_ = (pWVar17->super_Watcher)._vptr_Watcher;
                    local_248 = (undefined1  [8])*plVar12;
                  }
                  local_240._M_p = (pointer)plVar12[1];
                  *plVar12 = (long)pWVar17;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  iVar8 = String::strStartsWith
                                    ((string *)local_248,(string *)(local_1c8._M_p + 0x10));
                  if (local_248 != (undefined1  [8])local_238) {
                    operator_delete((void *)local_248);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p);
                  }
                  if (iVar8 != -1) {
                    if ((WatcherInotify *)local_1e8._8_8_ == local_1d8) {
                      std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>::
                      _M_realloc_insert<efsw::Watcher*const&>
                                ((vector<efsw::Watcher*,std::allocator<efsw::Watcher*>> *)
                                 local_1e8._M_local_buf,(iterator)local_1e8._8_8_,
                                 (Watcher **)&local_1c8);
                    }
                    else {
                      *(pointer *)local_1e8._8_8_ = local_1c8._M_p;
                      local_1e8._8_8_ = local_1e8._8_8_ + 8;
                    }
                  }
                }
                p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
              } while (p_Var13 != local_1f0);
            }
            Mutex::unlock((Mutex *)local_1f8._M_p);
            uVar9 = local_1e8._8_8_;
            uVar21 = local_1e8._M_allocated_capacity;
            if (local_1e8._M_allocated_capacity != local_1e8._8_8_) {
              lVar16 = (long)(local_1e8._8_8_ - local_1e8._0_8_) >> 3;
              pVar24 = std::get_temporary_buffer<efsw::Watcher*>
                                 ((lVar16 - (lVar16 + 1 >> 0x3f)) + 1 >> 1);
              local_218._8_8_ = pVar24.first;
              if ((Watcher **)local_218._8_8_ == (Watcher **)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,__gnu_cxx::__ops::_Iter_comp_iter<efsw::FileWatcherInotify::run()::__0>>
                          (uVar21,uVar9);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,efsw::Watcher**,long,__gnu_cxx::__ops::_Iter_comp_iter<efsw::FileWatcherInotify::run()::__0>>
                          (uVar21,uVar9,local_218._8_8_,pVar24.second);
              }
              operator_delete((void *)local_218._8_8_);
            }
            uVar21 = local_1e8._8_8_;
            if (local_1e8._M_allocated_capacity == local_1e8._8_8_) {
              local_128[0] = local_118;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
              (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                        (this,pWVar23,&ppVar22->second,0x200,(string *)local_128);
              if (local_128[0] != local_118) {
                operator_delete(local_128[0]);
              }
            }
            else {
              do {
                pWVar5 = *(Watcher **)(uVar21 + -8);
                local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                pcVar6 = (pWVar5->Directory)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_148,pcVar6,pcVar6 + (pWVar5->Directory)._M_string_length
                          );
                pWVar14 = watcherContainsDirectory(this,&local_148);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p);
                }
                if (pWVar14 != (Watcher *)0x0) {
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  pcVar6 = (pWVar5->Directory)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_168,pcVar6,
                             pcVar6 + (pWVar5->Directory)._M_string_length);
                  FileSystem::fileNameFromPath((string *)local_248,&local_168);
                  local_d8[0] = local_c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
                  (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                            (this,pWVar14,local_248,0x200,(string *)local_d8);
                  if (local_d8[0] != local_c8) {
                    operator_delete(local_d8[0]);
                  }
                  if (local_248 != (undefined1  [8])local_238) {
                    operator_delete((void *)local_248);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p);
                  }
                }
                uVar21 = uVar21 + -8;
              } while (uVar21 != local_1e8._M_allocated_capacity);
            }
            ppVar15 = local_1a0.
                      super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            p_Var20 = local_1f0;
            ppVar22 = local_208;
            uVar21 = local_218._M_allocated_capacity;
            if ((Watcher **)local_1e8._M_allocated_capacity != (Watcher **)0x0) {
              operator_delete((void *)local_1e8._M_allocated_capacity);
              ppVar15 = local_1a0.
                        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              p_Var20 = local_1f0;
              ppVar22 = local_208;
              uVar21 = local_218._M_allocated_capacity;
            }
          }
          else if (ppVar4 != ppVar18) {
            pWVar23 = ppVar22->first;
            do {
              if (ppVar18->first == pWVar23) goto LAB_0010ba4e;
              ppVar18 = ppVar18 + 1;
              uVar21 = local_218._M_allocated_capacity;
            } while (ppVar18 != ppVar4);
          }
          ppVar22 = ppVar22 + 1;
        } while (ppVar22 != ppVar15);
      }
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_200);
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_1a0);
    }
    if (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) == 0) {
      operator_delete__(local_1d0);
      if (local_1c0 != local_1b8._M_local_buf + 8) {
        operator_delete(local_1c0);
      }
      return;
    }
  } while( true );
}

Assistant:

void FileWatcherInotify::run() {
	char* buff = new char[BUFF_SIZE];
	memset( buff, 0, BUFF_SIZE );
	WatchMap::iterator wit;

	WatcherInotify* currentMoveFrom = NULL;
	u_int32_t currentMoveCookie = -1;
	bool lastWasMovedFrom = false;
	std::string prevOldFileName;

	do {
		fd_set rfds;
		FD_ZERO( &rfds );
		FD_SET( mFD, &rfds );
		timeval timeout;
		timeout.tv_sec = 0;
		timeout.tv_usec = 100000;

		if ( select( FD_SETSIZE, &rfds, NULL, NULL, &timeout ) > 0 ) {
			ssize_t len;

			len = read( mFD, buff, BUFF_SIZE );

			if ( len != -1 ) {
				ssize_t i = 0;

				while ( i < len ) {
					struct inotify_event* pevent = (struct inotify_event*)&buff[i];

					{
						{
							Lock lock( mWatchesLock );

							wit = mWatches.find( pevent->wd );
						}

						if ( wit != mWatches.end() ) {
							handleAction( wit->second, (char*)pevent->name, pevent->mask );

							if ( ( pevent->mask & IN_MOVED_TO ) && wit->second == currentMoveFrom &&
								 pevent->cookie == currentMoveCookie ) {
								/// make pair success
								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							} else if ( pevent->mask & IN_MOVED_FROM ) {
								// Previous event was moved from and current event is moved from
								// Treat it as a DELETE or moved ouside watches
								if ( lastWasMovedFrom && currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = wit->second;
								currentMoveCookie = pevent->cookie;
							} else {
								/// Keep track of the IN_MOVED_FROM events to know
								/// if the IN_MOVED_TO event is also fired
								if ( currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							}
						}

						lastWasMovedFrom = ( pevent->mask & IN_MOVED_FROM ) != 0;
						if ( pevent->mask & IN_MOVED_FROM )
							prevOldFileName = std::string( (char*)pevent->name );
					}

					i += sizeof( struct inotify_event ) + pevent->len;
				}
			}
		} else {
			// Here means no event received
			// If last event is IN_MOVED_FROM, we assume no IN_MOVED_TO
			if ( currentMoveFrom ) {
				mMovedOutsideWatches.push_back(
					std::make_pair( currentMoveFrom, currentMoveFrom->OldFileName ) );
			}

			currentMoveFrom = NULL;
			currentMoveCookie = -1;
		}

		if ( !mMovedOutsideWatches.empty() ) {
			// We need to make a copy since the element mMovedOutsideWatches could be modified
			// during the iteration.
			std::vector<std::pair<WatcherInotify*, std::string>> movedOutsideWatches(
				mMovedOutsideWatches );

			/// In case that the IN_MOVED_TO is never fired means that the file was moved to other
			/// folder
			for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator it =
					  movedOutsideWatches.begin();
				  it != movedOutsideWatches.end(); ++it ) {

				// Skip if the watch has already being removed
				if ( mMovedOutsideWatches.size() != movedOutsideWatches.size() ) {
					bool found = false;
					for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
							  mMovedOutsideWatches.begin();
						  mMovedOutsideWatches.end() != itm; ++itm ) {
						if ( itm->first == it->first ) {
							found = true;
							break;
						}
					}
					if ( !found )
						continue;
				}

				Watcher* watch = ( *it ).first;
				const std::string& oldFileName = ( *it ).second;

				/// Check if the file move was a folder already being watched
				std::vector<Watcher*> eraseWatches;

				{
					Lock lock( mWatchesLock );

					for ( ; wit != mWatches.end(); ++wit ) {
						Watcher* oldWatch = wit->second;

						if ( oldWatch != watch &&
							 -1 != String::strStartsWith( watch->Directory + oldFileName + "/",
														  oldWatch->Directory ) ) {
							eraseWatches.push_back( oldWatch );
						}
					}
				}

				/// Remove invalid watches
				std::stable_sort( eraseWatches.begin(), eraseWatches.end(),
								  []( const Watcher* left, const Watcher* right ) {
									  return left->Directory < right->Directory;
								  } );

				if ( eraseWatches.empty() ) {
					handleAction( watch, oldFileName, IN_DELETE );
				} else {
					for ( std::vector<Watcher*>::reverse_iterator eit = eraseWatches.rbegin();
						  eit != eraseWatches.rend(); ++eit ) {
						Watcher* rmWatch = *eit;

						/// Create Delete event for removed watches that have been moved too
						if ( Watcher* cntWatch = watcherContainsDirectory( rmWatch->Directory ) ) {
							handleAction( cntWatch,
										  FileSystem::fileNameFromPath( rmWatch->Directory ),
										  IN_DELETE );
						}
					}
				}
			}

			mMovedOutsideWatches.clear();
		}
	} while ( mInitOK );

	delete[] buff;
}